

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes(Bac_Ntk_t *p)

{
  int iVar1;
  Vec_Ptr_t *vArray;
  Vec_Ptr_t *Entry;
  Vec_Ptr_t *vBoxes;
  int iBox;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_NtkBoxNum(p);
  vArray = Vec_PtrAllocExact(iVar1);
  for (vBoxes._4_4_ = 0; iVar1 = Bac_NtkObjNum(p), vBoxes._4_4_ < iVar1;
      vBoxes._4_4_ = vBoxes._4_4_ + 1) {
    iVar1 = Bac_ObjIsBox(p,vBoxes._4_4_);
    if (iVar1 != 0) {
      Entry = Bac_NtkTransformToPtrBox(p,vBoxes._4_4_);
      Vec_PtrPush(vArray,Entry);
    }
  }
  iVar1 = Ptr_CheckArray(vArray);
  if (iVar1 == 0) {
    __assert_fail("Ptr_CheckArray(vBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x1aa,"Vec_Ptr_t *Bac_NtkTransformToPtrBoxes(Bac_Ntk_t *)");
  }
  return vArray;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes( Bac_Ntk_t * p )
{
    int iBox;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Bac_NtkBoxNum(p) );
    Bac_NtkForEachBox( p, iBox )
        Vec_PtrPush( vBoxes, Bac_NtkTransformToPtrBox(p, iBox) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}